

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_debug.cpp
# Opt level: O0

FString __thiscall FGLDebug::SeverityToString(FGLDebug *this,GLenum severity)

{
  GLenum severity_local;
  FString *s;
  
  FString::FString((FString *)this);
  if (severity == 0x826b) {
    FString::operator=((FString *)this,"notification");
  }
  else if (severity == 0x9146) {
    FString::operator=((FString *)this,"high severity");
  }
  else if (severity == 0x9147) {
    FString::operator=((FString *)this,"medium severity");
  }
  else if (severity == 0x9148) {
    FString::operator=((FString *)this,"low severity");
  }
  else {
    FString::Format((FString *)this,"%d",(ulong)severity);
  }
  return (FString)(char *)this;
}

Assistant:

FString FGLDebug::SeverityToString(GLenum severity)
{
	FString s;
	switch (severity)
	{
	case GL_DEBUG_SEVERITY_LOW: s = "low severity"; break;
	case GL_DEBUG_SEVERITY_MEDIUM: s = "medium severity"; break;
	case GL_DEBUG_SEVERITY_HIGH: s = "high severity"; break;
	case GL_DEBUG_SEVERITY_NOTIFICATION: s = "notification"; break;
	default: s.Format("%d", (int)severity);
	}
	return s;
}